

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_severity stumpless_get_entry_severity(stumpless_entry *entry)

{
  int prival;
  stumpless_severity sVar1;
  
  if (entry != (stumpless_entry *)0x0) {
    pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
    prival = entry->prival;
    pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
    clear_error();
    sVar1 = get_severity(prival);
    return sVar1;
  }
  raise_argument_empty("entry was NULL");
  return ~STUMPLESS_SEVERITY_EMERG;
}

Assistant:

enum stumpless_severity
stumpless_get_entry_severity( const struct stumpless_entry *entry ) {
  int prival;

  if( !entry ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "entry" ) );
    return -1;
  }

  lock_entry( entry );
  prival = entry->prival;
  unlock_entry( entry );

  clear_error(  );
  return get_severity( prival );
}